

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

unique_ptr<char_*[],_std::default_delete<char_*[]>_> __thiscall
CommandReader::args(CommandReader *this)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  CommandReader *pCVar4;
  long in_RSI;
  
  pCVar4 = this;
  if (*(char *)(in_RSI + 2) == '\x01') {
    std::make_unique<char*[]>((size_t)this);
    lVar1 = 0;
    uVar2 = 0;
    while( true ) {
      uVar3 = *(long *)(in_RSI + 0x30) - *(long *)(in_RSI + 0x28) >> 5;
      if (uVar3 <= uVar2) break;
      *(undefined8 *)(*(long *)this + lVar1) = *(undefined8 *)(*(long *)(in_RSI + 0x28) + lVar1 * 4)
      ;
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 8;
    }
    pCVar4 = (CommandReader *)(uVar3 * 8 + *(long *)this);
  }
  pCVar4->forced = false;
  pCVar4->escape = false;
  pCVar4->enclosed = false;
  pCVar4->field_0x3 = 0;
  pCVar4->state = STATE_NORMAL;
  return (__uniq_ptr_data<char_*,_std::default_delete<char_*[]>,_true,_true>)
         (__uniq_ptr_data<char_*,_std::default_delete<char_*[]>,_true,_true>)this;
}

Assistant:

std::unique_ptr<char *[]> args() const {
    // same
    if (!this->enclosed) {
      auto empty = std::unique_ptr<char *[]>();
      return empty;
    }

    auto args = std::make_unique<char *[]>(this->arguments.size() + 1);

    for (size_t i = 0; i < this->arguments.size(); i++) {
      args[i] = (char *)this->arguments[i].c_str();
    }

    args[this->arguments.size()] = nullptr;

    return args;
  }